

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommentReliablePdu.cpp
# Opt level: O0

void __thiscall DIS::CommentReliablePdu::unmarshal(CommentReliablePdu *this,DataStream *dataStream)

{
  undefined1 local_78 [8];
  VariableDatum x_1;
  size_t idx_1;
  undefined1 local_30 [8];
  FixedDatum x;
  size_t idx;
  DataStream *dataStream_local;
  CommentReliablePdu *this_local;
  
  SimulationManagementWithReliabilityFamilyPdu::unmarshal
            (&this->super_SimulationManagementWithReliabilityFamilyPdu,dataStream);
  DataStream::operator>>(dataStream,&this->_numberOfFixedDatumRecords);
  DataStream::operator>>(dataStream,&this->_numberOfVariableDatumRecords);
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::clear(&this->_fixedDatumRecords);
  x._fixedDatumID = 0;
  x._fixedDatumValue = 0;
  for (; (ulong)x._8_8_ < (ulong)this->_numberOfFixedDatumRecords; x._8_8_ = x._8_8_ + 1) {
    FixedDatum::FixedDatum((FixedDatum *)local_30);
    FixedDatum::unmarshal((FixedDatum *)local_30,dataStream);
    std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::push_back
              (&this->_fixedDatumRecords,(value_type *)local_30);
    FixedDatum::~FixedDatum((FixedDatum *)local_30);
  }
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::clear
            (&this->_variableDatumRecords);
  for (x_1._variableDatums.
       super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      x_1._variableDatums.
      super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage <
      (pointer)(ulong)this->_numberOfVariableDatumRecords;
      x_1._variableDatums.
      super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(x_1._variableDatums.
                             super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            _vptr_EightByteChunk + 1)) {
    VariableDatum::VariableDatum((VariableDatum *)local_78);
    VariableDatum::unmarshal((VariableDatum *)local_78,dataStream);
    std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::push_back
              (&this->_variableDatumRecords,(value_type *)local_78);
    VariableDatum::~VariableDatum((VariableDatum *)local_78);
  }
  return;
}

Assistant:

void CommentReliablePdu::unmarshal(DataStream& dataStream)
{
    SimulationManagementWithReliabilityFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    dataStream >> _numberOfFixedDatumRecords;
    dataStream >> _numberOfVariableDatumRecords;

     _fixedDatumRecords.clear();
     for(size_t idx = 0; idx < _numberOfFixedDatumRecords; idx++)
     {
        FixedDatum x;
        x.unmarshal(dataStream);
        _fixedDatumRecords.push_back(x);
     }

     _variableDatumRecords.clear();
     for(size_t idx = 0; idx < _numberOfVariableDatumRecords; idx++)
     {
        VariableDatum x;
        x.unmarshal(dataStream);
        _variableDatumRecords.push_back(x);
     }
}